

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdvariablebyte.h
# Opt level: O2

void __thiscall
FastPForLib::MaskedVByte::encodeArray
          (MaskedVByte *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  uint uVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  size_t sVar5;
  byte bVar6;
  long lVar7;
  
  puVar2 = out;
  for (sVar5 = 0; puVar3 = puVar2, puVar4 = puVar2, length != sVar5; sVar5 = sVar5 + 1) {
    uVar1 = in[sVar5];
    bVar6 = (byte)uVar1;
    if (uVar1 < 0x80) {
      *(byte *)puVar2 = bVar6;
      lVar7 = 1;
    }
    else if (uVar1 < 0x4000) {
      *(byte *)puVar2 = bVar6 | 0x80;
      *(char *)((long)puVar2 + 1) = (char)(uVar1 >> 7);
      lVar7 = 2;
    }
    else if (uVar1 < 0x200000) {
      *(byte *)puVar2 = bVar6 | 0x80;
      *(byte *)((long)puVar2 + 1) = (byte)(uVar1 >> 7) | 0x80;
      *(char *)((long)puVar2 + 2) = (char)(uVar1 >> 0xe);
      lVar7 = 3;
    }
    else {
      *(byte *)puVar2 = bVar6 | 0x80;
      *(byte *)((long)puVar2 + 1) = (byte)(uVar1 >> 7) | 0x80;
      *(byte *)((long)puVar2 + 2) = (byte)(uVar1 >> 0xe) | 0x80;
      bVar6 = (byte)(uVar1 >> 0x15);
      if (uVar1 < 0x10000000) {
        *(byte *)((long)puVar2 + 3) = bVar6;
        lVar7 = 4;
      }
      else {
        *(byte *)((long)puVar2 + 3) = bVar6 | 0x80;
        lVar7 = 5;
        *(byte *)(puVar2 + 1) = (byte)(uVar1 >> 0x1c);
      }
    }
    puVar2 = (uint32_t *)((long)puVar2 + lVar7);
  }
  for (; ((ulong)puVar3 & 3) != 0; puVar3 = (uint32_t *)((long)puVar3 + 1)) {
    *(undefined1 *)puVar4 = 0xff;
    puVar4 = (uint32_t *)((long)puVar4 + 1);
  }
  *nvalue = (ulong)((long)puVar2 + ((ulong)(-(int)puVar2 & 3) - (long)out)) >> 2;
  return;
}

Assistant:

void encodeArray(const uint32_t *in, const size_t length, uint32_t *out,
                   size_t &nvalue) {
    const uint8_t *const initbout = reinterpret_cast<uint8_t *>(out);
    uint8_t *bout = reinterpret_cast<uint8_t *>(out);
    for (size_t k = 0; k < length; ++k) {
      const uint32_t val(in[k]);
      /**
       * Code below could be shorter. Whether it could be faster
       * depends on your compiler and machine.
       */
      if (val < (1U << 7)) {
        *bout = val & 0x7F;
        ++bout;
      } else if (val < (1U << 14)) {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 7);
        ++bout;
      } else if (val < (1U << 21)) {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 7) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 14);
        ++bout;
      } else if (val < (1U << 28)) {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 7) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 14) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 21);
        ++bout;
      } else {
        *bout = static_cast<uint8_t>((val & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 7) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 14) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(((val >> 21) & 0x7F) | (1U << 7));
        ++bout;
        *bout = static_cast<uint8_t>(val >> 28);
        ++bout;
      }
    }
    while (needPaddingTo32Bits(bout)) {
      *bout++ = 0xFFU;
    }
    const size_t storageinbytes = bout - initbout;
    nvalue = storageinbytes / 4;
  }